

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.h
# Opt level: O3

bool __thiscall
BaseParticleFixture<pica::Particle<(pica::Dimension)2>>::
eqParticles_<pica::Particle<(pica::Dimension)2>,pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>>::ConstParticleRef>
          (BaseParticleFixture<pica::Particle<(pica::Dimension)2>> *this,
          Particle<(pica::Dimension)2> a,ConstParticleRef b)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ConstParticleRef local_60;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  MomentumType local_38;
  
  local_60.particles = b.particles;
  local_60.idx = b.idx;
  lVar7 = (long)local_60.idx;
  bVar4 = false;
  pdVar1 = (local_60.particles)->positions[0].super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start + lVar7;
  bVar5 = false;
  if ((((a.position.x == *pdVar1) && (bVar5 = bVar4, !NAN(a.position.x) && !NAN(*pdVar1))) &&
      (pdVar1 = (local_60.particles)->positions[1].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start + lVar7, a.position.y == *pdVar1)) && (!NAN(a.position.y) && !NAN(*pdVar1))
     ) {
    lVar8 = (long)a.typeIndex * 0x10;
    local_48 = *(double *)(pica::ParticleTypes::types + lVar8);
    uStack_40 = 0;
    local_50 = a.p.x * 29979245800.0 * local_48;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)2>_>::ConstParticleRef::getMomentum
              (&local_38,&local_60);
    bVar5 = false;
    if ((local_50 == local_38.x) && (!NAN(local_50) && !NAN(local_38.x))) {
      auVar3._8_8_ = -(ulong)(local_38.z == local_48 * a.p.z * 29979245800.0);
      auVar3._0_8_ = -(ulong)(local_38.y == local_48 * a.p.y * 29979245800.0);
      uVar6 = movmskpd((int)lVar7,auVar3);
      if (((uVar6 & 1) != 0) && ((byte)((byte)uVar6 >> 1) != 0)) {
        lVar7 = (long)((local_60.particles)->typeIndex).
                      super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_start[local_60.idx] * 0x10;
        pdVar1 = (double *)(pica::ParticleTypes::types + lVar7);
        if ((((*(double *)(pica::ParticleTypes::types + lVar8) != *pdVar1) ||
             (NAN(*(double *)(pica::ParticleTypes::types + lVar8)) || NAN(*pdVar1))) ||
            (dVar2 = *(double *)(pica::ParticleTypes::types + 8 + lVar8),
            pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar7), dVar2 != *pdVar1)) ||
           (NAN(dVar2) || NAN(*pdVar1))) {
          bVar5 = false;
        }
        else {
          bVar5 = (bool)(-(((local_60.particles)->factors).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[local_60.idx] == a.factor) & 1);
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool eqParticles_(ConstParticleRef1 a, ConstParticleRef2 b) const
    {
        return (a.getPosition() == b.getPosition()) &&
            (a.getMomentum() == b.getMomentum()) &&
            (a.getMass() == b.getMass()) &&
            (a.getCharge() == b.getCharge()) &&
            (a.getFactor() == b.getFactor());
    }